

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_>::rehash
          (Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *this,size_t sizeHint)

{
  Entry *key;
  ulong uVar1;
  Span *pSVar2;
  PrivateShared *pPVar3;
  undefined8 uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  Node<QNetworkRequest::Attribute,_QVariant> *pNVar13;
  ulong uVar14;
  ulong uVar15;
  Span *pSVar16;
  size_t index;
  long lVar17;
  size_t numBuckets;
  long lVar18;
  R RVar19;
  Bucket BVar20;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar17 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar17 ^ 0x3f) & 0x3f);
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar19 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar19.spans;
  this->numBuckets = numBuckets;
  if (0x7f < uVar1) {
    uVar14 = 0;
    pSVar16 = pSVar2;
    do {
      lVar17 = 0;
      do {
        if ((ulong)pSVar16->offsets[lVar17] != 0xff) {
          key = pSVar2[uVar14].entries + pSVar16->offsets[lVar17];
          uVar15 = (this->seed >> 0x20 ^ this->seed ^ (ulong)*(uint *)(key->storage).data) *
                   -0x2917014799a6026d;
          uVar15 = (uVar15 >> 0x20 ^ uVar15) * -0x2917014799a6026d;
          BVar20 = findBucketWithHash<QNetworkRequest::Attribute>
                             (this,(Attribute *)key,uVar15 >> 0x20 ^ uVar15);
          pNVar13 = Span<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_>::insert
                              (BVar20.span,BVar20.index);
          pNVar13->key = *(Attribute *)(key->storage).data;
          pPVar3 = *(PrivateShared **)((key->storage).data + 8);
          uVar4 = *(undefined8 *)((key->storage).data + 0x10);
          uVar5 = (key->storage).data[0x20];
          uVar6 = (key->storage).data[0x21];
          uVar7 = (key->storage).data[0x22];
          uVar8 = (key->storage).data[0x23];
          uVar9 = (key->storage).data[0x24];
          uVar10 = (key->storage).data[0x25];
          uVar11 = (key->storage).data[0x26];
          uVar12 = (key->storage).data[0x27];
          *(undefined8 *)((long)&(pNVar13->value).d.data + 0x10) =
               *(undefined8 *)((key->storage).data + 0x18);
          (pNVar13->value).d.field_0x18 = uVar5;
          (pNVar13->value).d.field_0x19 = uVar6;
          (pNVar13->value).d.field_0x1a = uVar7;
          (pNVar13->value).d.field_0x1b = uVar8;
          (pNVar13->value).d.field_0x1c = uVar9;
          (pNVar13->value).d.field_0x1d = uVar10;
          (pNVar13->value).d.field_0x1e = uVar11;
          (pNVar13->value).d.field_0x1f = uVar12;
          (pNVar13->value).d.data.shared = pPVar3;
          *(undefined8 *)((long)&(pNVar13->value).d.data + 8) = uVar4;
          (key->storage).data[8] = '\0';
          (key->storage).data[9] = '\0';
          (key->storage).data[10] = '\0';
          (key->storage).data[0xb] = '\0';
          (key->storage).data[0xc] = '\0';
          (key->storage).data[0xd] = '\0';
          (key->storage).data[0xe] = '\0';
          (key->storage).data[0xf] = '\0';
          (key->storage).data[0x10] = '\0';
          (key->storage).data[0x11] = '\0';
          (key->storage).data[0x12] = '\0';
          (key->storage).data[0x13] = '\0';
          (key->storage).data[0x14] = '\0';
          (key->storage).data[0x15] = '\0';
          (key->storage).data[0x16] = '\0';
          (key->storage).data[0x17] = '\0';
          (key->storage).data[0x18] = '\0';
          (key->storage).data[0x19] = '\0';
          (key->storage).data[0x1a] = '\0';
          (key->storage).data[0x1b] = '\0';
          (key->storage).data[0x1c] = '\0';
          (key->storage).data[0x1d] = '\0';
          (key->storage).data[0x1e] = '\0';
          (key->storage).data[0x1f] = '\0';
          (key->storage).data[0x20] = '\x02';
          (key->storage).data[0x21] = '\0';
          (key->storage).data[0x22] = '\0';
          (key->storage).data[0x23] = '\0';
          (key->storage).data[0x24] = '\0';
          (key->storage).data[0x25] = '\0';
          (key->storage).data[0x26] = '\0';
          (key->storage).data[0x27] = '\0';
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x80);
      Span<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_>::freeData(pSVar2 + uVar14);
      uVar14 = uVar14 + 1;
      pSVar16 = pSVar16 + 1;
    } while (uVar14 != uVar1 >> 7);
  }
  if (pSVar2 != (Span *)0x0) {
    lVar17 = *(long *)&pSVar2[-1].allocated;
    if (lVar17 != 0) {
      lVar18 = lVar17 * 0x90;
      do {
        Span<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_>::freeData
                  ((Span<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *)
                   (pSVar2[-1].offsets + lVar18));
        lVar18 = lVar18 + -0x90;
      } while (lVar18 != 0);
    }
    operator_delete__(&pSVar2[-1].allocated,lVar17 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }